

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O3

String * Unicode::toString(String *__return_storage_ptr__,uint32 ch)

{
  Data *pDVar1;
  
  pDVar1 = (Data *)operator_new__(0x25);
  __return_storage_ptr__->data = pDVar1;
  pDVar1->str = (char *)(pDVar1 + 1);
  *(undefined1 *)&pDVar1[1].str = 0;
  pDVar1->len = 0;
  pDVar1->ref = 1;
  pDVar1->capacity = 4;
  append(ch,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static String toString(uint32 ch)
  {
#ifdef _UNICODE
    String result(2);
#else
    String result(4);
#endif
    append(ch, result);
    return result;
  }